

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O2

bool sptk::SnPrintf<sptk::uint24_t>
               (uint24_t *data,string *print_format,size_t buffer_size,char *buffer)

{
  int iVar1;
  undefined8 in_R9;
  bool bVar2;
  
  bVar2 = false;
  if (((buffer != (char *)0x0) && (buffer_size != 0)) && (print_format->_M_string_length != 0)) {
    iVar1 = snprintf(buffer,buffer_size,(print_format->_M_dataplus)._M_p,
                     (ulong)*(uint3 *)data->value,(ulong)*(uint3 *)data->value,in_R9,0);
    bVar2 = -1 < iVar1;
  }
  return bVar2;
}

Assistant:

bool SnPrintf(uint24_t data, const std::string& print_format,
              std::size_t buffer_size, char* buffer) {
  if (print_format.empty() || 0 == buffer_size || NULL == buffer) {
    return false;
  }

  return (std::snprintf(buffer, buffer_size, print_format.c_str(),
                        static_cast<int>(data)) < 0)
             ? false
             : true;
}